

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_tools.cc
# Opt level: O2

Ptr __thiscall core::image::byte_to_double_image(image *this,ConstPtr *image)

{
  element_type *peVar1;
  pointer puVar2;
  long lVar3;
  uint uVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  invalid_argument *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  double dVar7;
  Ptr PVar8;
  
  if ((image->super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>).
      _M_ptr != (element_type *)0x0) {
    Image<double>::create();
    peVar1 = (image->
             super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    TypedImageBase<double>::allocate
              (*(TypedImageBase<double> **)this,
               (peVar1->super_TypedImageBase<unsigned_char>).super_ImageBase.w,
               (peVar1->super_TypedImageBase<unsigned_char>).super_ImageBase.h,
               (peVar1->super_TypedImageBase<unsigned_char>).super_ImageBase.c);
    peVar1 = (image->
             super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    puVar2 = (peVar1->super_TypedImageBase<unsigned_char>).data.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = *(int *)((long)&(peVar1->super_TypedImageBase<unsigned_char>).data.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data + 8) - (int)puVar2;
    _Var6._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)uVar4;
    if ((int)uVar4 < 1) {
      p_Var5 = _Var6._M_pi;
    }
    lVar3 = *(long *)this;
    for (; p_Var5 != _Var6._M_pi;
        _Var6._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      ((long)&(_Var6._M_pi)->_vptr__Sp_counted_base + 1)) {
      dVar7 = (double)*(byte *)((long)&(_Var6._M_pi)->_vptr__Sp_counted_base + (long)puVar2) / 255.0
      ;
      if (dVar7 <= 0.0) {
        dVar7 = 0.0;
      }
      if (1.0 <= dVar7) {
        dVar7 = 1.0;
      }
      *(double *)(*(long *)(lVar3 + 0x18) + (long)_Var6._M_pi * 8) = dVar7;
    }
    PVar8.super___shared_ptr<core::Image<double>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var6._M_pi;
    PVar8.super___shared_ptr<core::Image<double>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (Ptr)PVar8.super___shared_ptr<core::Image<double>,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"Null image given");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

DoubleImage::Ptr
byte_to_double_image (ByteImage::ConstPtr image)
{
    if (image == nullptr)
        throw std::invalid_argument("Null image given");

    DoubleImage::Ptr img = DoubleImage::create();
    img->allocate(image->width(), image->height(), image->channels());
    for (int i = 0; i < image->get_value_amount(); ++i)
    {
        double value = static_cast<double>(image->at(i)) / 255.0;
        img->at(i) = std::min(1.0, std::max(0.0, value));
    }
    return img;
}